

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ZeroRTTAccept_Test::TestBody
          (QUICMethodTest_ZeroRTTAccept_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  char *pcVar4;
  SSL *pSVar5;
  SSL_SESSION *pSVar6;
  pointer psVar7;
  pointer pMVar8;
  MockQUICTransport *pMVar9;
  unsigned_long uVar10;
  char *in_R9;
  AssertHelper local_b18;
  Message local_b10;
  ssl_early_data_reason_t local_b08;
  ssl_early_data_reason_t local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_5;
  Message local_ae8;
  ssl_early_data_reason_t local_ae0;
  ssl_early_data_reason_t local_adc;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_aa8;
  Message local_aa0;
  int local_a94;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_a60;
  Message local_a58;
  int local_a4c;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_a18;
  Message local_a10;
  bool local_a01;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_9d0;
  Message local_9c8;
  bool local_9b9;
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_988;
  Message local_980;
  int local_974;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_940;
  Message local_938;
  int local_92c;
  undefined1 local_928 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_8f8;
  Message local_8f0;
  bool local_8e1;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_8b0;
  Message local_8a8;
  bool local_899;
  undefined1 local_898 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_868;
  Message local_860;
  bool local_851;
  undefined1 local_850 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_820;
  Message local_818;
  bool local_809;
  undefined1 local_808 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_7d8;
  Message local_7d0;
  int local_7c4;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__24;
  Message local_7a8;
  int local_7a0;
  int local_79c;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_768;
  Message local_760;
  bool local_751;
  undefined1 local_750 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_720;
  Message local_718;
  bool local_709;
  undefined1 local_708 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_6d8;
  Message local_6d0;
  int local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar__21;
  Message local_6a8;
  int local_6a0;
  int local_69c;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_668;
  Message local_660;
  bool local_651;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_620;
  Message local_618;
  int local_60c;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_5d8;
  Message local_5d0;
  bool local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_590;
  Message local_588;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_548;
  Message local_540;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_4b8;
  Message local_4b0;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_470;
  Message local_468;
  int local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_428;
  Message local_420;
  int local_414;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_398;
  Message local_390;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_350;
  Message local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__7;
  Message local_290;
  int local_288;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__4;
  Message local_190;
  int local_188;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  QUICMethodTest_ZeroRTTAccept_Test *this_local;
  
  QUICMethodTest::DefaultQUICMethod
            ((SSL_QUIC_METHOD *)&gtest_ar_.message_,&this->super_QUICMethodTest);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_set_session_cache_mode(psVar3,3);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_set_early_data_enabled(psVar3,1);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).server_ctx_);
  SSL_CTX_set_early_data_enabled(psVar3,1);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  local_4c = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_48,&local_4c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1d1e,pcVar4);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_QUICMethodTest).server_ctx_);
    local_ac = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&session,(internal *)local_a8,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1d1f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&session);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      QUICMethodTest::CreateClientSessionForQUIC((QUICMethodTest *)&gtest_ar__2.message_);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_f8,
                 (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_f8,(AssertionResult *)0x4f1864,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1d22,pcVar4);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_139 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_138,&local_139,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_138,
                     (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1d24,pcVar4);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_148);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_QUICMethodTest).client_);
          pSVar6 = (SSL_SESSION *)
                   std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                              &gtest_ar__2.message_);
          SSL_set_session(pSVar5,pSVar6);
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_QUICMethodTest).client_);
          local_184 = SSL_do_handshake(pSVar5);
          local_188 = 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_180,"SSL_do_handshake(client_.get())","1",&local_184,
                     &local_188);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1d28,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_190);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_190);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               (&(this->super_QUICMethodTest).client_);
            local_1ac = SSL_in_early_data(psVar7);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a8,&local_1ac,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_1a8,
                         (AssertionResult *)"SSL_in_early_data(client_.get())","false","true",in_R9)
              ;
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1d29,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            pMVar8 = std::
                     unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                     ::operator->(&(this->super_QUICMethodTest).transport_);
            pMVar9 = MockQUICTransportPair::client(pMVar8);
            local_1f1 = MockQUICTransport::HasWriteSecret(pMVar9,ssl_encryption_early_data);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
            if (!bVar1) {
              testing::Message::Message(&local_200);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1f0,
                         (AssertionResult *)
                         "transport_->client()->HasWriteSecret(ssl_encryption_early_data)","false",
                         "true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_208,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1d2b,pcVar4);
              testing::internal::AssertHelper::operator=(&local_208,&local_200);
              testing::internal::AssertHelper::~AssertHelper(&local_208);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_200);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               (&(this->super_QUICMethodTest).server_);
            uVar10 = std::numeric_limits<unsigned_long>::max();
            local_239 = QUICMethodTest::ProvideHandshakeData(psVar7,uVar10);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_238,&local_239,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
            if (!bVar1) {
              testing::Message::Message(&local_248);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_238,
                         (AssertionResult *)"ProvideHandshakeData(server_.get())","false","true",
                         in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_250,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1d2f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_250,&local_248);
              testing::internal::AssertHelper::~AssertHelper(&local_250);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_248);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        (&(this->super_QUICMethodTest).server_);
              local_284 = SSL_do_handshake(pSVar5);
              local_288 = 1;
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_280,"SSL_do_handshake(server_.get())","1",&local_284,
                         &local_288);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
              if (!bVar1) {
                testing::Message::Message(&local_290);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1d30,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__7.message_,&local_290);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_290);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_QUICMethodTest).server_);
                local_2ac = SSL_in_early_data(psVar7);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_2a8,&local_2ac,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2a8);
                if (!bVar1) {
                  testing::Message::Message(&local_2b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_2a8,
                             (AssertionResult *)"SSL_in_early_data(server_.get())","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2c0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d31,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_2b8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                pMVar8 = std::
                         unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                         ::operator->(&(this->super_QUICMethodTest).transport_);
                local_2f1 = MockQUICTransportPair::SecretsMatch(pMVar8,ssl_encryption_early_data);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2f0);
                if (!bVar1) {
                  testing::Message::Message(&local_300);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__9.message_,(internal *)local_2f0,
                             (AssertionResult *)
                             "transport_->SecretsMatch(ssl_encryption_early_data)","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_308,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d32,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_308,&local_300);
                  testing::internal::AssertHelper::~AssertHelper(&local_308);
                  std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                  testing::Message::~Message(&local_300);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                pMVar8 = std::
                         unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                         ::operator->(&(this->super_QUICMethodTest).transport_);
                pMVar9 = MockQUICTransportPair::server(pMVar8);
                local_339 = MockQUICTransport::HasWriteSecret(pMVar9,ssl_encryption_application);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_338,&local_339,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_338);
                if (!bVar1) {
                  testing::Message::Message(&local_348);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__10.message_,(internal *)local_338,
                             (AssertionResult *)
                             "transport_->server()->HasWriteSecret(ssl_encryption_application)",
                             "false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_350,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d35,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_350,&local_348);
                  testing::internal::AssertHelper::~AssertHelper(&local_350);
                  std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                  testing::Message::~Message(&local_348);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                pMVar8 = std::
                         unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                         ::operator->(&(this->super_QUICMethodTest).transport_);
                pMVar9 = MockQUICTransportPair::server(pMVar8);
                local_381 = MockQUICTransport::HasReadSecret(pMVar9,ssl_encryption_application);
                local_381 = !local_381;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_380,&local_381,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_380);
                if (!bVar1) {
                  testing::Message::Message(&local_390);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__11.message_,(internal *)local_380,
                             (AssertionResult *)
                             "transport_->server()->HasReadSecret(ssl_encryption_application)",
                             "true","false",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_398,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d36,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_398,&local_390);
                  testing::internal::AssertHelper::~AssertHelper(&local_398);
                  std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                  testing::Message::~Message(&local_390);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                local_3c9 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3c8);
                if (!bVar1) {
                  testing::Message::Message(&local_3d8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__12.message_,(internal *)local_3c8,
                             (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_3e0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d39,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
                  testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                  std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                  testing::Message::~Message(&local_3d8);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).client_);
                  local_414 = SSL_session_reused(psVar7);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_410,&local_414,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_410);
                  if (!bVar1) {
                    testing::Message::Message(&local_420);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__13.message_,(internal *)local_410,
                               (AssertionResult *)"SSL_session_reused(client_.get())","false","true"
                               ,in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_428,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d3d,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_428,&local_420);
                    testing::internal::AssertHelper::~AssertHelper(&local_428);
                    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                    testing::Message::~Message(&local_420);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).server_);
                  local_45c = SSL_session_reused(psVar7);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_458,&local_45c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_458);
                  if (!bVar1) {
                    testing::Message::Message(&local_468);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__14.message_,(internal *)local_458,
                               (AssertionResult *)"SSL_session_reused(server_.get())","false","true"
                               ,in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_470,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d3e,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_470,&local_468);
                    testing::internal::AssertHelper::~AssertHelper(&local_470);
                    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                    testing::Message::~Message(&local_468);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).client_);
                  iVar2 = SSL_in_early_data(psVar7);
                  local_4a1 = iVar2 == 0;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_4a0);
                  if (!bVar1) {
                    testing::Message::Message(&local_4b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__15.message_,(internal *)local_4a0,
                               (AssertionResult *)"SSL_in_early_data(client_.get())","true","false",
                               in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d3f,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
                    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
                    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                    testing::Message::~Message(&local_4b0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).server_);
                  iVar2 = SSL_in_early_data(psVar7);
                  local_4e9 = iVar2 == 0;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_4e8);
                  if (!bVar1) {
                    testing::Message::Message(&local_4f8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__16.message_,(internal *)local_4e8,
                               (AssertionResult *)"SSL_in_early_data(server_.get())","true","false",
                               in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_500,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d40,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                    testing::internal::AssertHelper::~AssertHelper(&local_500);
                    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                    testing::Message::~Message(&local_4f8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).client_);
                  local_534 = SSL_early_data_accepted(psVar7);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_530,&local_534,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_530);
                  if (!bVar1) {
                    testing::Message::Message(&local_540);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__17.message_,(internal *)local_530,
                               (AssertionResult *)"SSL_early_data_accepted(client_.get())","false",
                               "true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_548,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d41,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_548,&local_540);
                    testing::internal::AssertHelper::~AssertHelper(&local_548);
                    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                    testing::Message::~Message(&local_540);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).server_);
                  local_57c = SSL_early_data_accepted(psVar7);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_578,&local_57c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_578);
                  if (!bVar1) {
                    testing::Message::Message(&local_588);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__18.message_,(internal *)local_578,
                               (AssertionResult *)"SSL_early_data_accepted(server_.get())","false",
                               "true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_590,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d42,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_590,&local_588);
                    testing::internal::AssertHelper::~AssertHelper(&local_590);
                    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                    testing::Message::~Message(&local_588);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).client_);
                  uVar10 = std::numeric_limits<unsigned_long>::max();
                  local_5c1 = QUICMethodTest::ProvideHandshakeData(psVar7,uVar10);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_5c0,&local_5c1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_5c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_5d0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__19.message_,(internal *)local_5c0,
                               (AssertionResult *)"ProvideHandshakeData(client_.get())","false",
                               "true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_5d8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d45,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
                    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
                    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
                    testing::Message::~Message(&local_5d0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
                  psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_QUICMethodTest).client_);
                  local_60c = SSL_process_quic_post_handshake(psVar7);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_608,&local_60c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_608);
                  if (!bVar1) {
                    testing::Message::Message(&local_618);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__20.message_,(internal *)local_608,
                               (AssertionResult *)"SSL_process_quic_post_handshake(client_.get())",
                               "false","true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_620,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d46,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_620,&local_618);
                    testing::internal::AssertHelper::~AssertHelper(&local_620);
                    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                    testing::Message::~Message(&local_618);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
                  local_651 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_650,&local_651,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_650);
                  if (!bVar1) {
                    testing::Message::Message(&local_660);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_2.message_,(internal *)local_650,
                               (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_668,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d4a,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_668,&local_660);
                    testing::internal::AssertHelper::~AssertHelper(&local_668);
                    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                    testing::Message::~Message(&local_660);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                              (&(this->super_QUICMethodTest).client_);
                    pSVar6 = (SSL_SESSION *)
                             std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                        &(anonymous_namespace)::g_last_session);
                    SSL_set_session(pSVar5,pSVar6);
                    pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                              (&(this->super_QUICMethodTest).client_);
                    local_69c = SSL_do_handshake(pSVar5);
                    local_6a0 = 1;
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_698,"SSL_do_handshake(client_.get())","1",
                               &local_69c,&local_6a0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_698);
                    if (!bVar1) {
                      testing::Message::Message(&local_6a8);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_698);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar__21.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1d4e,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar__21.message_,&local_6a8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar__21.message_);
                      testing::Message::~Message(&local_6a8);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_QUICMethodTest).client_);
                      local_6c4 = SSL_in_early_data(psVar7);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_6c0,&local_6c4,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6c0);
                      if (!bVar1) {
                        testing::Message::Message(&local_6d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__22.message_,(internal *)local_6c0,
                                   (AssertionResult *)"SSL_in_early_data(client_.get())","false",
                                   "true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_6d8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d4f,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
                        testing::internal::AssertHelper::~AssertHelper(&local_6d8);
                        std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                        testing::Message::~Message(&local_6d0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
                      pMVar8 = std::
                               unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                               ::operator->(&(this->super_QUICMethodTest).transport_);
                      pMVar9 = MockQUICTransportPair::client(pMVar8);
                      local_709 = MockQUICTransport::HasWriteSecret
                                            (pMVar9,ssl_encryption_early_data);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_708,&local_709,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_708);
                      if (!bVar1) {
                        testing::Message::Message(&local_718);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__23.message_,(internal *)local_708,
                                   (AssertionResult *)
                                   "transport_->client()->HasWriteSecret(ssl_encryption_early_data)"
                                   ,"false","true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_720,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d51,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_720,&local_718);
                        testing::internal::AssertHelper::~AssertHelper(&local_720);
                        std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
                        testing::Message::~Message(&local_718);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
                      psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_QUICMethodTest).server_);
                      uVar10 = std::numeric_limits<unsigned_long>::max();
                      local_751 = QUICMethodTest::ProvideHandshakeData(psVar7,uVar10);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_750,&local_751,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_750);
                      if (!bVar1) {
                        testing::Message::Message(&local_760);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_3.message_,(internal *)local_750,
                                   (AssertionResult *)"ProvideHandshakeData(server_.get())","false",
                                   "true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_768,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d55,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_768,&local_760);
                        testing::internal::AssertHelper::~AssertHelper(&local_768);
                        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                        testing::Message::~Message(&local_760);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                  (&(this->super_QUICMethodTest).server_);
                        local_79c = SSL_do_handshake(pSVar5);
                        local_7a0 = 1;
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_798,"SSL_do_handshake(server_.get())","1",
                                   &local_79c,&local_7a0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_798);
                        if (!bVar1) {
                          testing::Message::Message(&local_7a8);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_798);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__24.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x1d56,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__24.message_,&local_7a8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__24.message_);
                          testing::Message::~Message(&local_7a8);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             (&(this->super_QUICMethodTest).server_);
                          local_7c4 = SSL_in_early_data(psVar7);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_7c0,&local_7c4,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7c0);
                          if (!bVar1) {
                            testing::Message::Message(&local_7d0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__25.message_,(internal *)local_7c0,
                                       (AssertionResult *)"SSL_in_early_data(server_.get())","false"
                                       ,"true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_7d8,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d57,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
                            testing::internal::AssertHelper::~AssertHelper(&local_7d8);
                            std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
                            testing::Message::~Message(&local_7d0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
                          pMVar8 = std::
                                   unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                   ::operator->(&(this->super_QUICMethodTest).transport_);
                          local_809 = MockQUICTransportPair::SecretsMatch
                                                (pMVar8,ssl_encryption_early_data);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_808,&local_809,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_808);
                          if (!bVar1) {
                            testing::Message::Message(&local_818);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__26.message_,(internal *)local_808,
                                       (AssertionResult *)
                                       "transport_->SecretsMatch(ssl_encryption_early_data)","false"
                                       ,"true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_820,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d58,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_820,&local_818);
                            testing::internal::AssertHelper::~AssertHelper(&local_820);
                            std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
                            testing::Message::~Message(&local_818);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
                          pMVar8 = std::
                                   unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                   ::operator->(&(this->super_QUICMethodTest).transport_);
                          pMVar9 = MockQUICTransportPair::server(pMVar8);
                          local_851 = MockQUICTransport::HasWriteSecret
                                                (pMVar9,ssl_encryption_application);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_850,&local_851,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_850);
                          if (!bVar1) {
                            testing::Message::Message(&local_860);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__27.message_,(internal *)local_850,
                                       (AssertionResult *)
                                       "transport_->server()->HasWriteSecret(ssl_encryption_application)"
                                       ,"false","true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_868,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d5b,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_868,&local_860);
                            testing::internal::AssertHelper::~AssertHelper(&local_868);
                            std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
                            testing::Message::~Message(&local_860);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
                          pMVar8 = std::
                                   unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                                   ::operator->(&(this->super_QUICMethodTest).transport_);
                          pMVar9 = MockQUICTransportPair::server(pMVar8);
                          local_899 = MockQUICTransport::HasReadSecret
                                                (pMVar9,ssl_encryption_application);
                          local_899 = !local_899;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_898,&local_899,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_898);
                          if (!bVar1) {
                            testing::Message::Message(&local_8a8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__28.message_,(internal *)local_898,
                                       (AssertionResult *)
                                       "transport_->server()->HasReadSecret(ssl_encryption_application)"
                                       ,"true","false",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_8b0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d5c,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
                            testing::internal::AssertHelper::~AssertHelper(&local_8b0);
                            std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
                            testing::Message::~Message(&local_8a8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
                          local_8e1 = QUICMethodTest::CompleteHandshakesForQUIC
                                                (&this->super_QUICMethodTest);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_8e0,&local_8e1,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_8e0);
                          if (!bVar1) {
                            testing::Message::Message(&local_8f0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__29.message_,(internal *)local_8e0,
                                       (AssertionResult *)"CompleteHandshakesForQUIC()","false",
                                       "true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_8f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d5f,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
                            testing::internal::AssertHelper::~AssertHelper(&local_8f8);
                            std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
                            testing::Message::~Message(&local_8f0);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).client_);
                            local_92c = SSL_session_reused(psVar7);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_928,&local_92c,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_928);
                            if (!bVar1) {
                              testing::Message::Message(&local_938);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__30.message_,(internal *)local_928,
                                         (AssertionResult *)"SSL_session_reused(client_.get())",
                                         "false","true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_940,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d63,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_940,&local_938);
                              testing::internal::AssertHelper::~AssertHelper(&local_940);
                              std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
                              testing::Message::~Message(&local_938);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_928)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).server_);
                            local_974 = SSL_session_reused(psVar7);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_970,&local_974,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_970);
                            if (!bVar1) {
                              testing::Message::Message(&local_980);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__31.message_,(internal *)local_970,
                                         (AssertionResult *)"SSL_session_reused(server_.get())",
                                         "false","true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_988,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d64,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_988,&local_980);
                              testing::internal::AssertHelper::~AssertHelper(&local_988);
                              std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
                              testing::Message::~Message(&local_980);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_970)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).client_);
                            iVar2 = SSL_in_early_data(psVar7);
                            local_9b9 = iVar2 == 0;
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_9b8,&local_9b9,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_9b8);
                            if (!bVar1) {
                              testing::Message::Message(&local_9c8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__32.message_,(internal *)local_9b8,
                                         (AssertionResult *)"SSL_in_early_data(client_.get())",
                                         "true","false",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_9d0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d65,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
                              testing::internal::AssertHelper::~AssertHelper(&local_9d0);
                              std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
                              testing::Message::~Message(&local_9c8);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).server_);
                            iVar2 = SSL_in_early_data(psVar7);
                            local_a01 = iVar2 == 0;
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_a00,&local_a01,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_a00);
                            if (!bVar1) {
                              testing::Message::Message(&local_a10);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__33.message_,(internal *)local_a00,
                                         (AssertionResult *)"SSL_in_early_data(server_.get())",
                                         "true","false",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_a18,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d66,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_a18,&local_a10);
                              testing::internal::AssertHelper::~AssertHelper(&local_a18);
                              std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
                              testing::Message::~Message(&local_a10);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).client_);
                            local_a4c = SSL_early_data_accepted(psVar7);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_a48,&local_a4c,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_a48);
                            if (!bVar1) {
                              testing::Message::Message(&local_a58);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__34.message_,(internal *)local_a48,
                                         (AssertionResult *)"SSL_early_data_accepted(client_.get())"
                                         ,"false","true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_a60,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d67,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_a60,&local_a58);
                              testing::internal::AssertHelper::~AssertHelper(&local_a60);
                              std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
                              testing::Message::~Message(&local_a58);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).server_);
                            local_a94 = SSL_early_data_accepted(psVar7);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_a90,&local_a94,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_a90);
                            if (!bVar1) {
                              testing::Message::Message(&local_aa0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar_4.message_,(internal *)local_a90,
                                         (AssertionResult *)"SSL_early_data_accepted(server_.get())"
                                         ,"false","true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_aa8,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d68,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_aa8,&local_aa0);
                              testing::internal::AssertHelper::~AssertHelper(&local_aa8);
                              std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                              testing::Message::~Message(&local_aa0);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).client_);
                            local_adc = SSL_get_early_data_reason(psVar7);
                            local_ae0 = ssl_early_data_accepted;
                            testing::internal::EqHelper::
                            Compare<ssl_early_data_reason_t,_ssl_early_data_reason_t,_nullptr>
                                      ((EqHelper *)local_ad8,
                                       "SSL_get_early_data_reason(client_.get())",
                                       "ssl_early_data_accepted",&local_adc,&local_ae0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_ad8);
                            if (!bVar1) {
                              testing::Message::Message(&local_ae8);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_ad8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d69,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_5.message_,&local_ae8);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_5.message_);
                              testing::Message::~Message(&local_ae8);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8)
                            ;
                            psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).server_);
                            local_b04 = SSL_get_early_data_reason(psVar7);
                            local_b08 = ssl_early_data_accepted;
                            testing::internal::EqHelper::
                            Compare<ssl_early_data_reason_t,_ssl_early_data_reason_t,_nullptr>
                                      ((EqHelper *)local_b00,
                                       "SSL_get_early_data_reason(server_.get())",
                                       "ssl_early_data_accepted",&local_b04,&local_b08);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_b00);
                            if (!bVar1) {
                              testing::Message::Message(&local_b10);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_b00);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_b18,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d6a,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
                              testing::internal::AssertHelper::~AssertHelper(&local_b18);
                              testing::Message::~Message(&local_b10);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00)
                            ;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, ZeroRTTAccept) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_early_data_enabled(client_ctx_.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx_.get(), 1);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  bssl::UniquePtr<SSL_SESSION> session = CreateClientSessionForQUIC();
  ASSERT_TRUE(session);

  ASSERT_TRUE(CreateClientAndServer());
  SSL_set_session(client_.get(), session.get());

  // The client handshake should return immediately into the early data state.
  ASSERT_EQ(SSL_do_handshake(client_.get()), 1);
  EXPECT_TRUE(SSL_in_early_data(client_.get()));
  // The transport should have keys for sending 0-RTT data.
  EXPECT_TRUE(transport_->client()->HasWriteSecret(ssl_encryption_early_data));

  // The server will consume the ClientHello and also enter the early data
  // state.
  ASSERT_TRUE(ProvideHandshakeData(server_.get()));
  ASSERT_EQ(SSL_do_handshake(server_.get()), 1);
  EXPECT_TRUE(SSL_in_early_data(server_.get()));
  EXPECT_TRUE(transport_->SecretsMatch(ssl_encryption_early_data));
  // At this point, the server has half-RTT write keys, but it cannot access
  // 1-RTT read keys until client Finished.
  EXPECT_TRUE(transport_->server()->HasWriteSecret(ssl_encryption_application));
  EXPECT_FALSE(transport_->server()->HasReadSecret(ssl_encryption_application));

  // Finish up the client and server handshakes.
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  // Both sides can now exchange 1-RTT data.
  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
  EXPECT_FALSE(SSL_in_early_data(client_.get()));
  EXPECT_FALSE(SSL_in_early_data(server_.get()));
  EXPECT_TRUE(SSL_early_data_accepted(client_.get()));
  EXPECT_TRUE(SSL_early_data_accepted(server_.get()));

  // Finish handling post-handshake messages after the first 0-RTT resumption.
  EXPECT_TRUE(ProvideHandshakeData(client_.get()));
  EXPECT_TRUE(SSL_process_quic_post_handshake(client_.get()));

  // Perform a second 0-RTT resumption attempt, and confirm that 0-RTT is
  // accepted again.
  ASSERT_TRUE(CreateClientAndServer());
  SSL_set_session(client_.get(), g_last_session.get());

  // The client handshake should return immediately into the early data state.
  ASSERT_EQ(SSL_do_handshake(client_.get()), 1);
  EXPECT_TRUE(SSL_in_early_data(client_.get()));
  // The transport should have keys for sending 0-RTT data.
  EXPECT_TRUE(transport_->client()->HasWriteSecret(ssl_encryption_early_data));

  // The server will consume the ClientHello and also enter the early data
  // state.
  ASSERT_TRUE(ProvideHandshakeData(server_.get()));
  ASSERT_EQ(SSL_do_handshake(server_.get()), 1);
  EXPECT_TRUE(SSL_in_early_data(server_.get()));
  EXPECT_TRUE(transport_->SecretsMatch(ssl_encryption_early_data));
  // At this point, the server has half-RTT write keys, but it cannot access
  // 1-RTT read keys until client Finished.
  EXPECT_TRUE(transport_->server()->HasWriteSecret(ssl_encryption_application));
  EXPECT_FALSE(transport_->server()->HasReadSecret(ssl_encryption_application));

  // Finish up the client and server handshakes.
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  // Both sides can now exchange 1-RTT data.
  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
  EXPECT_FALSE(SSL_in_early_data(client_.get()));
  EXPECT_FALSE(SSL_in_early_data(server_.get()));
  EXPECT_TRUE(SSL_early_data_accepted(client_.get()));
  EXPECT_TRUE(SSL_early_data_accepted(server_.get()));
  EXPECT_EQ(SSL_get_early_data_reason(client_.get()), ssl_early_data_accepted);
  EXPECT_EQ(SSL_get_early_data_reason(server_.get()), ssl_early_data_accepted);
}